

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool run_container_is_subset_array(run_container_t *container1,array_container_t *container2)

{
  ushort uVar1;
  int iVar2;
  uint16_t *puVar3;
  _Bool _Var4;
  int iVar5;
  int iVar6;
  int iVar7;
  int32_t n_runs;
  long lVar8;
  ushort uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  ushort uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  
  lVar8 = cpuid_Extended_Feature_Enumeration_info(7);
  if ((*(uint *)(lVar8 + 4) & 0x20) == 0) {
    iVar5 = container1->n_runs;
    lVar8 = (long)iVar5;
    if (0 < lVar8) {
      lVar12 = 0;
      do {
        iVar5 = iVar5 + (uint)container1->runs[lVar12].length;
        lVar12 = lVar12 + 1;
      } while (lVar8 != lVar12);
    }
  }
  else {
    iVar5 = _avx2_run_container_cardinality(container1);
  }
  iVar2 = container2->cardinality;
  if (iVar2 < iVar5) {
LAB_0010ead2:
    _Var4 = false;
  }
  else {
    if (0 < (long)container1->n_runs) {
      puVar3 = container2->array;
      iVar5 = -1;
      lVar8 = 0;
      do {
        uVar1 = container1->runs[lVar8].value;
        uVar15 = (uint)container1->runs[lVar8].length;
        uVar10 = uVar1 + uVar15;
        iVar6 = iVar5 + 1;
        iVar7 = iVar6;
        iVar16 = iVar6;
        if (iVar6 < iVar2) {
          if (puVar3[iVar6] < uVar1) {
            iVar11 = iVar5 + 2;
            iVar14 = 1;
            if (iVar11 < iVar2) {
              iVar14 = 1;
              do {
                uVar9 = puVar3[iVar11];
                if (uVar1 <= uVar9) goto LAB_0010eb73;
                iVar16 = iVar14 * 2;
                iVar11 = iVar6 + iVar14 * 2;
                iVar14 = iVar16;
              } while (iVar11 < iVar2);
            }
            uVar9 = puVar3[(long)iVar2 + -1];
            iVar11 = iVar2 + -1;
LAB_0010eb73:
            iVar16 = iVar11;
            if (((uVar9 != uVar1) && (iVar16 = iVar2, uVar1 <= uVar9)) &&
               (iVar16 = iVar11, iVar6 + (iVar14 >> 1) + 1 != iVar11)) {
              iVar14 = (iVar14 >> 1) + iVar6;
              do {
                iVar16 = iVar11 + iVar14 >> 1;
                if (puVar3[iVar16] == uVar1) break;
                iVar17 = iVar16;
                if (puVar3[iVar16] < uVar1) {
                  iVar17 = iVar11;
                  iVar14 = iVar16;
                }
                iVar16 = iVar17;
                iVar11 = iVar17;
              } while (iVar14 + 1 != iVar17);
            }
          }
          uVar9 = (ushort)uVar10;
          if (puVar3[iVar6] < uVar9) {
            iVar5 = iVar5 + 2;
            iVar11 = 1;
            if (iVar5 < iVar2) {
              iVar11 = 1;
              do {
                uVar13 = puVar3[iVar5];
                if (uVar9 <= uVar13) goto LAB_0010ebd9;
                iVar7 = iVar11 * 2;
                iVar5 = iVar6 + iVar11 * 2;
                iVar11 = iVar7;
              } while (iVar5 < iVar2);
            }
            uVar13 = puVar3[(long)iVar2 + -1];
            iVar5 = iVar2 + -1;
LAB_0010ebd9:
            iVar7 = iVar5;
            if (((uVar13 != uVar9) && (iVar7 = iVar2, uVar9 <= uVar13)) &&
               (iVar7 = iVar5, (iVar11 >> 1) + iVar6 + 1 != iVar5)) {
              iVar6 = (iVar11 >> 1) + iVar6;
              do {
                iVar7 = iVar6 + iVar5 >> 1;
                if (puVar3[iVar7] == uVar9) break;
                if (uVar9 <= puVar3[iVar7]) {
                  iVar5 = iVar7;
                  iVar7 = iVar6;
                }
                iVar6 = iVar7;
                iVar7 = iVar5;
              } while (iVar6 + 1 != iVar5);
            }
          }
        }
        iVar5 = iVar7;
        if (iVar16 == iVar2) {
          return false;
        }
        if (iVar5 - iVar16 != uVar15) {
          return false;
        }
        if ((puVar3[iVar16] != uVar1) || (uVar10 != puVar3[iVar5])) goto LAB_0010ead2;
        lVar8 = lVar8 + 1;
      } while (lVar8 != container1->n_runs);
    }
    _Var4 = true;
  }
  return _Var4;
}

Assistant:

bool run_container_is_subset_array(const run_container_t* container1,
                                   const array_container_t* container2) {
    if (run_container_cardinality(container1) > container2->cardinality)
        return false;
    int32_t start_pos = -1, stop_pos = -1;
    for (int i = 0; i < container1->n_runs; ++i) {
        int32_t start = container1->runs[i].value;
        int32_t stop = start + container1->runs[i].length;
        start_pos = advanceUntil(container2->array, stop_pos,
                                 container2->cardinality, start);
        stop_pos = advanceUntil(container2->array, stop_pos,
                                container2->cardinality, stop);
        if (start_pos == container2->cardinality) {
            return false;
        } else if (stop_pos - start_pos != stop - start ||
                   container2->array[start_pos] != start ||
                   container2->array[stop_pos] != stop) {
            return false;
        }
    }
    return true;
}